

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_estimateDStreamSize_fromFrame(void *src,size_t srcSize)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ZSTD_frameHeader zfh;
  ZSTD_frameHeader ZStack_28;
  
  sVar1 = ZSTD_getFrameHeader_advanced(&ZStack_28,src,srcSize,ZSTD_f_zstd1);
  sVar2 = sVar1;
  if ((sVar1 < 0xffffffffffffff89) && (sVar2 = 0xffffffffffffffb8, sVar1 == 0)) {
    sVar2 = 0xfffffffffffffff0;
    if (ZStack_28.windowSize < 0x80000001) {
      uVar3 = 0x20000;
      if (ZStack_28.windowSize < 0x20000) {
        uVar3 = ZStack_28.windowSize;
      }
      sVar2 = ZStack_28.windowSize + (uVar3 & 0xffffffff) * 2 + 0x27208;
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_estimateDStreamSize_fromFrame(const void* src, size_t srcSize)
{
    U32 const windowSizeMax = 1U << ZSTD_WINDOWLOG_MAX;   /* note : should be user-selectable, but requires an additional parameter (or a dctx) */
    ZSTD_frameHeader zfh;
    size_t const err = ZSTD_getFrameHeader(&zfh, src, srcSize);
    if (ZSTD_isError(err)) return err;
    RETURN_ERROR_IF(err>0, srcSize_wrong);
    RETURN_ERROR_IF(zfh.windowSize > windowSizeMax,
                    frameParameter_windowTooLarge);
    return ZSTD_estimateDStreamSize((size_t)zfh.windowSize);
}